

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

bool __thiscall
s2textformat::ParsePoints
          (s2textformat *this,string_view str,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  string_view str_00;
  pointer this_00;
  bool bVar1;
  S2Point local_a0;
  reference local_88;
  S2LatLng *latlng;
  iterator __end1;
  iterator __begin1;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *__range1;
  undefined1 local_40 [8];
  vector<S2LatLng,_std::allocator<S2LatLng>_> latlngs;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  string_view str_local;
  
  latlngs.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)str.length_;
  std::vector<S2LatLng,_std::allocator<S2LatLng>_>::vector
            ((vector<S2LatLng,_std::allocator<S2LatLng>_> *)local_40);
  str_00.length_ = (size_type)str.ptr_;
  str_00.ptr_ = (char *)this;
  bVar1 = ParseLatLngs(str_00,(vector<S2LatLng,_std::allocator<S2LatLng>_> *)local_40);
  if (bVar1) {
    __end1 = std::vector<S2LatLng,_std::allocator<S2LatLng>_>::begin
                       ((vector<S2LatLng,_std::allocator<S2LatLng>_> *)local_40);
    latlng = (S2LatLng *)
             std::vector<S2LatLng,_std::allocator<S2LatLng>_>::end
                       ((vector<S2LatLng,_std::allocator<S2LatLng>_> *)local_40);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<S2LatLng_*,_std::vector<S2LatLng,_std::allocator<S2LatLng>_>_>
                                  *)&latlng);
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<S2LatLng_*,_std::vector<S2LatLng,_std::allocator<S2LatLng>_>_>::
                 operator*(&__end1);
      this_00 = latlngs.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      S2LatLng::ToPoint(&local_a0,local_88);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this_00,&local_a0);
      __gnu_cxx::__normal_iterator<S2LatLng_*,_std::vector<S2LatLng,_std::allocator<S2LatLng>_>_>::
      operator++(&__end1);
    }
    str_local.length_._7_1_ = true;
  }
  else {
    str_local.length_._7_1_ = false;
  }
  std::vector<S2LatLng,_std::allocator<S2LatLng>_>::~vector
            ((vector<S2LatLng,_std::allocator<S2LatLng>_> *)local_40);
  return str_local.length_._7_1_;
}

Assistant:

bool ParsePoints(string_view str, vector<S2Point>* vertices) {
  vector<S2LatLng> latlngs;
  if (!ParseLatLngs(str, &latlngs)) return false;
  for (const auto& latlng : latlngs) {
    vertices->push_back(latlng.ToPoint());
  }
  return true;
}